

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<sub_bound_token> *
read_left_bound_token
          (optional<sub_bound_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2,
          string_view buf_3,string_view buf_4)

{
  int iVar1;
  double dVar2;
  string_view buf_1_00;
  string_view buf;
  string_view buf_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  char *pcVar3;
  bool bVar4;
  double *pdVar5;
  operator_token *poVar6;
  char *pcVar7;
  optional<double> oVar8;
  optional<operator_token> oVar9;
  sub_bound_token local_188;
  _Storage<operator_token,_true> local_178;
  operator_type local_170;
  size_t local_168;
  char *pcStack_160;
  double local_158;
  size_t sStack_150;
  _Storage<operator_token,_true> local_140;
  optional<operator_token> operator_token_1;
  _Storage<double,_true> local_120;
  optional<double> value_opt_1;
  sub_bound_token local_108;
  _Storage<operator_token,_true> local_f8;
  operator_type local_f0;
  size_t local_e8;
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_d0;
  _Storage<operator_token,_true> local_c8;
  optional<operator_token> operator_token;
  _Storage<double,_true> local_a8;
  optional<double> value_opt;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_78;
  char *local_68;
  char *local_60;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_58;
  char *local_48;
  char *local_40;
  double local_38;
  double negative;
  double value;
  string_view buf_2_local;
  string_view buf_1_local;
  
  buf_2_local._M_len = (size_t)buf_2._M_str;
  value = (double)buf_2._M_len;
  pcVar7 = buf_1._M_str;
  local_48 = (char *)buf_1._M_len;
  negative = 0.0;
  local_38 = 1.0;
  local_40 = pcVar7;
  buf_2_local._M_str = local_48;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"+");
  __x_01._M_str = local_40;
  __x_01._M_len = (size_t)local_48;
  bVar4 = std::operator==(__x_01,local_58);
  if (!bVar4) {
    local_68 = buf_2_local._M_str;
    local_60 = pcVar7;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"-");
    __x_00._M_str = local_60;
    __x_00._M_len = (size_t)local_68;
    bVar4 = std::operator==(__x_00,local_78);
    if (!bVar4) {
      stack0xfffffffffffffed0 = buf_2_local._M_str;
      buf._M_str = pcVar7;
      buf._M_len = (size_t)buf_2_local._M_str;
      oVar8 = read_real(buf);
      local_120 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      value_opt_1.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ =
           oVar8.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      bVar4 = std::optional::operator_cast_to_bool((optional *)&local_120);
      if (!bVar4) {
        std::optional<sub_bound_token>::optional(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      pdVar5 = std::optional<double>::operator*((optional<double> *)&local_120);
      negative = *pdVar5;
      local_158 = value;
      sStack_150 = buf_2_local._M_len;
      local_168 = buf_3._M_len;
      pcStack_160 = buf_3._M_str;
      buf_1_00._M_str = (char *)buf_2_local._M_len;
      buf_1_00._M_len = (size_t)value;
      oVar9 = read_operator(buf_1_00,buf_3);
      local_178 = oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
                  super__Optional_payload_base<operator_token>._M_payload;
      local_170 = CONCAT31(local_170._1_3_,
                           oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
                           super__Optional_payload_base<operator_token>._M_engaged);
      operator_token_1.super__Optional_base<operator_token,_true,_true>._M_payload.
      super__Optional_payload_base<operator_token>._M_payload._M_value.op = local_170;
      local_140 = local_178;
      bVar4 = std::optional::operator_cast_to_bool((optional *)&local_140._M_value);
      if (!bVar4) {
        std::optional<sub_bound_token>::optional(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      dVar2 = negative * local_38;
      poVar6 = std::optional<operator_token>::operator->
                         ((optional<operator_token> *)&local_140._M_value);
      iVar1 = poVar6->read;
      poVar6 = std::optional<operator_token>::operator->
                         ((optional<operator_token> *)&local_140._M_value);
      sub_bound_token::sub_bound_token(&local_188,dVar2,iVar1 + 1,poVar6->op);
      std::optional<sub_bound_token>::optional<sub_bound_token,_true>
                (__return_storage_ptr__,&local_188);
      return __return_storage_ptr__;
    }
  }
  pcVar3 = buf_2_local._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &value_opt.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged,"-");
  __x._M_str = pcVar7;
  __x._M_len = (size_t)pcVar3;
  bVar4 = std::operator==(__x,stack0xffffffffffffff68);
  if (bVar4) {
    local_38 = -1.0;
  }
  stack0xffffffffffffff48 = value;
  buf_00._M_str = (char *)buf_2_local._M_len;
  buf_00._M_len = (size_t)value;
  oVar8 = read_real(buf_00);
  local_a8 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_payload;
  value_opt.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>
  ._M_payload._0_1_ =
       oVar8.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_engaged;
  bVar4 = std::optional::operator_cast_to_bool((optional *)&local_a8);
  if (bVar4) {
    pdVar5 = std::optional<double>::operator*((optional<double> *)&local_a8);
    negative = *pdVar5;
    local_d8 = buf_3._M_len;
    pcStack_d0 = buf_3._M_str;
    local_e8 = buf_4._M_len;
    pcStack_e0 = buf_4._M_str;
    oVar9 = read_operator(buf_3,buf_4);
    local_f8 = oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
               super__Optional_payload_base<operator_token>._M_payload;
    local_f0 = CONCAT31(local_f0._1_3_,
                        oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
                        super__Optional_payload_base<operator_token>._M_engaged);
    operator_token.super__Optional_base<operator_token,_true,_true>._M_payload.
    super__Optional_payload_base<operator_token>._M_payload._M_value.op = local_f0;
    local_c8 = local_f8;
    bVar4 = std::optional::operator_cast_to_bool((optional *)&local_c8._M_value);
    if (bVar4) {
      dVar2 = negative * local_38;
      poVar6 = std::optional<operator_token>::operator->
                         ((optional<operator_token> *)&local_c8._M_value);
      iVar1 = poVar6->read;
      poVar6 = std::optional<operator_token>::operator->
                         ((optional<operator_token> *)&local_c8._M_value);
      sub_bound_token::sub_bound_token(&local_108,dVar2,iVar1 + 2,poVar6->op);
      std::optional<sub_bound_token>::optional<sub_bound_token,_true>
                (__return_storage_ptr__,&local_108);
    }
    else {
      std::optional<sub_bound_token>::optional(__return_storage_ptr__);
    }
  }
  else {
    std::optional<sub_bound_token>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<sub_bound_token>
read_left_bound_token(const std::string_view buf_1,
                      const std::string_view buf_2,
                      const std::string_view buf_3,
                      const std::string_view buf_4) noexcept
{
    double value = 0.0;
    double negative = 1.0;

    if (buf_1 == "+" || buf_1 == "-") {
        if (buf_1 == "-")
            negative = -1.0;

        if (auto value_opt = read_real(buf_2); value_opt)
            value = *value_opt;
        else
            return std::nullopt;

        if (auto operator_token = read_operator(buf_3, buf_4); operator_token)
            return sub_bound_token(
              value * negative, operator_token->read + 2, operator_token->op);
        else
            return std::nullopt;
    } else {
        if (auto value_opt = read_real(buf_1); value_opt)
            value = *value_opt;
        else
            return std::nullopt;

        if (auto operator_token = read_operator(buf_2, buf_3); operator_token)
            return sub_bound_token(
              value * negative, operator_token->read + 1, operator_token->op);
        else
            return std::nullopt;
    }
}